

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  string *psVar3;
  int iVar4;
  string identifier;
  LocationRecorder location;
  string local_60;
  LocationRecorder local_40;
  
  if ((file->_has_bits_[0] & 2) != 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Multiple package definitions.","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_60);
    }
    this->had_errors_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    psVar3 = file->package_;
    if (psVar3 != (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    *(byte *)file->_has_bits_ = (byte)file->_has_bits_[0] & 0xfd;
  }
  bVar2 = Consume(this,"package");
  if (bVar2) {
    LocationRecorder::LocationRecorder(&local_40,root_location,2);
    LocationRecorder::RecordLegacyLocation(&local_40,&file->super_Message,NAME);
    do {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      bVar2 = ConsumeIdentifier(this,&local_60,"Expected identifier.");
      if (bVar2) {
        *(byte *)file->_has_bits_ = (byte)file->_has_bits_[0] | 2;
        psVar3 = file->package_;
        if (psVar3 == (string *)&internal::kEmptyString_abi_cxx11_) {
          psVar3 = (string *)operator_new(0x20);
          (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
          psVar3->_M_string_length = 0;
          (psVar3->field_2)._M_local_buf[0] = '\0';
          file->package_ = psVar3;
        }
        std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_60._M_dataplus._M_p);
        bVar2 = TryConsume(this,".");
        if (!bVar2) {
          iVar4 = 3;
          goto LAB_001bfbb3;
        }
        *(byte *)file->_has_bits_ = (byte)file->_has_bits_[0] | 2;
        psVar3 = file->package_;
        if (psVar3 == (string *)&internal::kEmptyString_abi_cxx11_) {
          psVar3 = (string *)operator_new(0x20);
          (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
          psVar3->_M_string_length = 0;
          (psVar3->field_2)._M_local_buf[0] = '\0';
          file->package_ = psVar3;
        }
        std::__cxx11::string::append((char *)psVar3);
        iVar4 = 0;
        bVar2 = true;
      }
      else {
        iVar4 = 1;
LAB_001bfbb3:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
    } while (iVar4 == 0);
    if (iVar4 == 3) {
      LocationRecorder::EndAt(&local_40,&this->input_->previous_);
      bVar2 = ConsumeEndOfDeclaration(this,";",&local_40);
    }
    LocationRecorder::~LocationRecorder(&local_40);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  DO(Consume("package"));

  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kPackageFieldNumber);
    location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

    while (true) {
      string identifier;
      DO(ConsumeIdentifier(&identifier, "Expected identifier."));
      file->mutable_package()->append(identifier);
      if (!TryConsume(".")) break;
      file->mutable_package()->append(".");
    }

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}